

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.cpp
# Opt level: O3

string * __thiscall
duckdb::Blob::ToBlob_abi_cxx11_(string *__return_storage_ptr__,Blob *this,string_t str)

{
  CastParameters *in_R8;
  string_t str_00;
  CastParameters parameters;
  undefined8 local_38;
  undefined1 local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined1 local_10;
  
  str_00.value._0_8_ = str.value._0_8_;
  local_38 = 0;
  local_30 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0xffffffffffffffff;
  local_10 = 0;
  str_00.value.pointer.ptr = (char *)&local_38;
  ToBlob_abi_cxx11_(__return_storage_ptr__,this,str_00,in_R8);
  return __return_storage_ptr__;
}

Assistant:

string Blob::ToBlob(string_t str) {
	CastParameters parameters;
	return Blob::ToBlob(str, parameters);
}